

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

bool ImGui::SetDragDropPayload(char *type,void *data,size_t data_size,ImGuiCond cond)

{
  int *piVar1;
  int iVar2;
  ImGuiContext *pIVar3;
  size_t sVar4;
  uchar *puVar5;
  uchar *puVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  size_t sVar10;
  
  pIVar3 = GImGui;
  if (type == (char *)0x0) {
    __assert_fail("type != __null",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                  ,0x27f3,
                  "bool ImGui::SetDragDropPayload(const char *, const void *, size_t, ImGuiCond)");
  }
  sVar4 = strlen(type);
  if (0x20 < sVar4) {
    __assert_fail("strlen(type) < ((int)(sizeof(payload.DataType) / sizeof(*(payload.DataType)))) && \"Payload type can be at most 32 characters long\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                  ,0x27f4,
                  "bool ImGui::SetDragDropPayload(const char *, const void *, size_t, ImGuiCond)");
  }
  if ((data == (void *)0x0 || data_size == 0) && ((data != (void *)0x0 || (data_size != 0)))) {
    __assert_fail("(data != __null && data_size > 0) || (data == __null && data_size == 0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                  ,0x27f5,
                  "bool ImGui::SetDragDropPayload(const char *, const void *, size_t, ImGuiCond)");
  }
  if (2 < (uint)cond) {
    __assert_fail("cond == ImGuiCond_Always || cond == ImGuiCond_Once",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                  ,0x27f6,
                  "bool ImGui::SetDragDropPayload(const char *, const void *, size_t, ImGuiCond)");
  }
  if ((pIVar3->DragDropPayload).SourceId == 0) {
    __assert_fail("payload.SourceId != 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                  ,0x27f7,
                  "bool ImGui::SetDragDropPayload(const char *, const void *, size_t, ImGuiCond)");
  }
  if ((1 < (uint)cond) && ((pIVar3->DragDropPayload).DataFrameCount != -1)) goto LAB_001375b6;
  strncpy((pIVar3->DragDropPayload).DataType,type,0x20);
  (pIVar3->DragDropPayload).DataType[0x20] = '\0';
  uVar8 = (pIVar3->DragDropPayloadBufHeap).Capacity;
  if ((int)uVar8 < 0) {
    if (GImGui != (ImGuiContext *)0x0) {
      piVar1 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar1 = *piVar1 + 1;
    }
    uVar8 = 0;
    puVar5 = (uchar *)(*GImAllocatorAllocFunc)(0,GImAllocatorUserData);
    puVar6 = (pIVar3->DragDropPayloadBufHeap).Data;
    if (puVar6 != (uchar *)0x0) {
      memcpy(puVar5,puVar6,(long)(pIVar3->DragDropPayloadBufHeap).Size);
      puVar6 = (pIVar3->DragDropPayloadBufHeap).Data;
      if ((puVar6 != (uchar *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + -1;
      }
      (*GImAllocatorFreeFunc)(puVar6,GImAllocatorUserData);
    }
    (pIVar3->DragDropPayloadBufHeap).Data = puVar5;
    (pIVar3->DragDropPayloadBufHeap).Capacity = 0;
  }
  (pIVar3->DragDropPayloadBufHeap).Size = 0;
  uVar7 = (uint)data_size;
  if (data_size < 0x11) {
    if (data_size != 0) {
      puVar6 = pIVar3->DragDropPayloadBufLocal;
      pIVar3->DragDropPayloadBufLocal[0] = '\0';
      pIVar3->DragDropPayloadBufLocal[1] = '\0';
      pIVar3->DragDropPayloadBufLocal[2] = '\0';
      pIVar3->DragDropPayloadBufLocal[3] = '\0';
      pIVar3->DragDropPayloadBufLocal[4] = '\0';
      pIVar3->DragDropPayloadBufLocal[5] = '\0';
      pIVar3->DragDropPayloadBufLocal[6] = '\0';
      pIVar3->DragDropPayloadBufLocal[7] = '\0';
      pIVar3->DragDropPayloadBufLocal[8] = '\0';
      pIVar3->DragDropPayloadBufLocal[9] = '\0';
      pIVar3->DragDropPayloadBufLocal[10] = '\0';
      pIVar3->DragDropPayloadBufLocal[0xb] = '\0';
      pIVar3->DragDropPayloadBufLocal[0xc] = '\0';
      pIVar3->DragDropPayloadBufLocal[0xd] = '\0';
      pIVar3->DragDropPayloadBufLocal[0xe] = '\0';
      pIVar3->DragDropPayloadBufLocal[0xf] = '\0';
      (pIVar3->DragDropPayload).Data = puVar6;
      goto LAB_001375a4;
    }
    (pIVar3->DragDropPayload).Data = (void *)0x0;
  }
  else {
    if ((int)uVar8 < (int)uVar7) {
      uVar9 = 8;
      if (uVar8 != 0) {
        uVar9 = (uVar8 >> 1) + uVar8;
      }
      sVar10 = (size_t)uVar9;
      if (uVar9 <= uVar7) {
        sVar10 = data_size & 0xffffffff;
      }
      if (GImGui != (ImGuiContext *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + 1;
      }
      puVar6 = (uchar *)(*GImAllocatorAllocFunc)(sVar10,GImAllocatorUserData);
      puVar5 = (pIVar3->DragDropPayloadBufHeap).Data;
      if (puVar5 != (uchar *)0x0) {
        memcpy(puVar6,puVar5,(long)(pIVar3->DragDropPayloadBufHeap).Size);
        puVar5 = (pIVar3->DragDropPayloadBufHeap).Data;
        if ((puVar5 != (uchar *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + -1;
        }
        (*GImAllocatorFreeFunc)(puVar5,GImAllocatorUserData);
      }
      (pIVar3->DragDropPayloadBufHeap).Data = puVar6;
      (pIVar3->DragDropPayloadBufHeap).Capacity = (int)sVar10;
    }
    else {
      puVar6 = (pIVar3->DragDropPayloadBufHeap).Data;
    }
    (pIVar3->DragDropPayloadBufHeap).Size = uVar7;
    (pIVar3->DragDropPayload).Data = puVar6;
LAB_001375a4:
    memcpy(puVar6,data,data_size);
  }
  (pIVar3->DragDropPayload).DataSize = uVar7;
LAB_001375b6:
  iVar2 = pIVar3->FrameCount;
  (pIVar3->DragDropPayload).DataFrameCount = iVar2;
  return pIVar3->DragDropAcceptFrameCount == iVar2 + -1 || pIVar3->DragDropAcceptFrameCount == iVar2
  ;
}

Assistant:

bool ImGui::SetDragDropPayload(const char* type, const void* data, size_t data_size, ImGuiCond cond)
{
    ImGuiContext& g = *GImGui;
    ImGuiPayload& payload = g.DragDropPayload;
    if (cond == 0)
        cond = ImGuiCond_Always;

    IM_ASSERT(type != NULL);
    IM_ASSERT(strlen(type) < IM_ARRAYSIZE(payload.DataType) && "Payload type can be at most 32 characters long");
    IM_ASSERT((data != NULL && data_size > 0) || (data == NULL && data_size == 0));
    IM_ASSERT(cond == ImGuiCond_Always || cond == ImGuiCond_Once);
    IM_ASSERT(payload.SourceId != 0);                               // Not called between BeginDragDropSource() and EndDragDropSource()

    if (cond == ImGuiCond_Always || payload.DataFrameCount == -1)
    {
        // Copy payload
        ImStrncpy(payload.DataType, type, IM_ARRAYSIZE(payload.DataType));
        g.DragDropPayloadBufHeap.resize(0);
        if (data_size > sizeof(g.DragDropPayloadBufLocal))
        {
            // Store in heap
            g.DragDropPayloadBufHeap.resize((int)data_size);
            payload.Data = g.DragDropPayloadBufHeap.Data;
            memcpy(payload.Data, data, data_size);
        }
        else if (data_size > 0)
        {
            // Store locally
            memset(&g.DragDropPayloadBufLocal, 0, sizeof(g.DragDropPayloadBufLocal));
            payload.Data = g.DragDropPayloadBufLocal;
            memcpy(payload.Data, data, data_size);
        }
        else
        {
            payload.Data = NULL;
        }
        payload.DataSize = (int)data_size;
    }
    payload.DataFrameCount = g.FrameCount;

    return (g.DragDropAcceptFrameCount == g.FrameCount) || (g.DragDropAcceptFrameCount == g.FrameCount - 1);
}